

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleDockWidget::child(QAccessibleDockWidget *this,int index)

{
  QDockWidget *pQVar1;
  QWidget *pQVar2;
  QDockWidgetLayout *pQVar3;
  long *plVar4;
  QAccessibleInterface *pQVar5;
  
  pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  pQVar2 = QDockWidget::titleBarWidget(pQVar1);
  if (pQVar2 == (QWidget *)0x0) {
    pQVar3 = dockWidgetLayout(this);
    plVar4 = (long *)(**(code **)(*(long *)&pQVar3->super_QLayout + 0xa8))(pQVar3,index);
    if (plVar4 == (long *)0x0) {
      return (QAccessibleInterface *)0x0;
    }
    pQVar2 = (QWidget *)(**(code **)(*plVar4 + 0x68))(plVar4);
  }
  else {
    pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar2 = QDockWidget::widget(pQVar1);
    if ((index == 1) || (index == 0 && pQVar2 == (QWidget *)0x0)) {
      pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = QDockWidget::titleBarWidget(pQVar1);
    }
    else {
      if (index != 0) {
        return (QAccessibleInterface *)0x0;
      }
      pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = QDockWidget::widget(pQVar1);
    }
  }
  pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar2->super_QObject);
  return pQVar5;
}

Assistant:

QAccessibleInterface *QAccessibleDockWidget::child(int index) const
{
    if (dockWidget()->titleBarWidget()) {
        if ((!dockWidget()->widget() && index == 0) || (index == 1))
            return QAccessible::queryAccessibleInterface(dockWidget()->titleBarWidget());
        if (index == 0)
            return QAccessible::queryAccessibleInterface(dockWidget()->widget());
    } else {
        QLayoutItem *item = dockWidgetLayout()->itemAt(index);
        if (item)
            return QAccessible::queryAccessibleInterface(item->widget());
    }
    return nullptr;
}